

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ternary_executor.hpp
# Opt level: O2

idx_t duckdb::TernaryExecutor::
      SelectLoop<duckdb::hugeint_t,duckdb::hugeint_t,duckdb::hugeint_t,duckdb::UpperInclusiveBetweenOperator,true,true,false>
                (hugeint_t *adata,hugeint_t *bdata,hugeint_t *cdata,SelectionVector *result_sel,
                idx_t count,SelectionVector *asel,SelectionVector *bsel,SelectionVector *csel,
                ValidityMask *avalidity,ValidityMask *bvalidity,ValidityMask *cvalidity,
                SelectionVector *true_sel,SelectionVector *false_sel)

{
  bool bVar1;
  ulong uVar2;
  ulong uVar3;
  idx_t iVar4;
  ulong uVar5;
  ulong uVar6;
  idx_t i;
  ulong uVar7;
  hugeint_t input;
  hugeint_t lower;
  hugeint_t upper;
  
  iVar4 = 0;
  for (uVar7 = 0; count != uVar7; uVar7 = uVar7 + 1) {
    uVar6 = uVar7;
    if (result_sel->sel_vector != (sel_t *)0x0) {
      uVar6 = (ulong)result_sel->sel_vector[uVar7];
    }
    uVar2 = uVar7;
    if (asel->sel_vector != (sel_t *)0x0) {
      uVar2 = (ulong)asel->sel_vector[uVar7];
    }
    uVar3 = uVar7;
    if (bsel->sel_vector != (sel_t *)0x0) {
      uVar3 = (ulong)bsel->sel_vector[uVar7];
    }
    uVar5 = uVar7;
    if (csel->sel_vector != (sel_t *)0x0) {
      uVar5 = (ulong)csel->sel_vector[uVar7];
    }
    input.upper = adata[uVar2].upper;
    input.lower = adata[uVar2].lower;
    lower.upper = bdata[uVar3].upper;
    lower.lower = bdata[uVar3].lower;
    upper.upper = cdata[uVar5].upper;
    upper.lower = cdata[uVar5].lower;
    bVar1 = UpperInclusiveBetweenOperator::Operation<duckdb::hugeint_t>(input,lower,upper);
    true_sel->sel_vector[iVar4] = (sel_t)uVar6;
    iVar4 = iVar4 + bVar1;
  }
  return iVar4;
}

Assistant:

static inline idx_t SelectLoop(const A_TYPE *__restrict adata, const B_TYPE *__restrict bdata,
	                               const C_TYPE *__restrict cdata, const SelectionVector *result_sel, idx_t count,
	                               const SelectionVector &asel, const SelectionVector &bsel,
	                               const SelectionVector &csel, ValidityMask &avalidity, ValidityMask &bvalidity,
	                               ValidityMask &cvalidity, SelectionVector *true_sel, SelectionVector *false_sel) {
		idx_t true_count = 0, false_count = 0;
		for (idx_t i = 0; i < count; i++) {
			auto result_idx = result_sel->get_index(i);
			auto aidx = asel.get_index(i);
			auto bidx = bsel.get_index(i);
			auto cidx = csel.get_index(i);
			bool comparison_result =
			    (NO_NULL || (avalidity.RowIsValid(aidx) && bvalidity.RowIsValid(bidx) && cvalidity.RowIsValid(cidx))) &&
			    OP::Operation(adata[aidx], bdata[bidx], cdata[cidx]);
			if (HAS_TRUE_SEL) {
				true_sel->set_index(true_count, result_idx);
				true_count += comparison_result;
			}
			if (HAS_FALSE_SEL) {
				false_sel->set_index(false_count, result_idx);
				false_count += !comparison_result;
			}
		}
		if (HAS_TRUE_SEL) {
			return true_count;
		} else {
			return count - false_count;
		}
	}